

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

void Abc_NtkStartReverseLevels(Abc_Ntk_t *pNtk,int nMaxLevelIncrease)

{
  int iVar1;
  int LevelR;
  Vec_Int_t *p;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pObj;
  
  iVar1 = Abc_NtkLevel(pNtk);
  pNtk->LevelMax = iVar1 + nMaxLevelIncrease;
  p = Vec_IntAlloc(0);
  pNtk->vLevelsR = p;
  Vec_IntFill(p,pNtk->vObjs->nSize + 1,0);
  p_00 = Abc_NtkDfsReverse(pNtk);
  for (iVar1 = 0; iVar1 < p_00->nSize; iVar1 = iVar1 + 1) {
    pObj = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar1);
    LevelR = Abc_ObjReverseLevelNew(pObj);
    Abc_ObjSetReverseLevel(pObj,LevelR);
  }
  Vec_PtrFree(p_00);
  return;
}

Assistant:

void Abc_NtkStartReverseLevels( Abc_Ntk_t * pNtk, int nMaxLevelIncrease )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    // remember the maximum number of direct levels
    pNtk->LevelMax = Abc_NtkLevel(pNtk) + nMaxLevelIncrease;
    // start the reverse levels
    pNtk->vLevelsR = Vec_IntAlloc( 0 );
    Vec_IntFill( pNtk->vLevelsR, 1 + Abc_NtkObjNumMax(pNtk), 0 );
    // compute levels in reverse topological order
    vNodes = Abc_NtkDfsReverse( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_ObjSetReverseLevel( pObj, Abc_ObjReverseLevelNew(pObj) );
    Vec_PtrFree( vNodes );
}